

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> __thiscall
duckdb::PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampSOperator>::GetTargetMemoryStream
          (PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampSOperator> *this)

{
  pointer pMVar1;
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> in_RDI;
  templated_unique_single_t *result;
  unsigned_long *in_stack_ffffffffffffffc0;
  uchar **in_stack_ffffffffffffffc8;
  
  duckdb::MemoryStream::GetData();
  duckdb::MemoryStream::GetCapacity();
  make_uniq<duckdb::MemoryStream,unsigned_char*,unsigned_long>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  pMVar1 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
           operator->((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                       *)in_RDI._M_head_impl);
  duckdb::MemoryStream::GetPosition();
  duckdb::MemoryStream::SetPosition((ulong)pMVar1);
  return (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
         (_Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>)
         in_RDI._M_head_impl;
}

Assistant:

unique_ptr<MemoryStream> GetTargetMemoryStream() const {
		auto result = make_uniq<MemoryStream>(target_stream.GetData(), target_stream.GetCapacity());
		result->SetPosition(target_stream.GetPosition());
		return result;
	}